

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBufferToImage::ReadImplementation::recordCommands
          (ReadImplementation *this,VkCommandBuffer cmdBuffer)

{
  VkExtent3D *pVVar1;
  undefined4 uVar3;
  deUint64 dVar2;
  undefined4 uVar4;
  VkBuffer buffer;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  Image *pIVar12;
  VkImage *pVVar13;
  BufferResource *pBVar14;
  Buffer *pBVar15;
  VkBuffer *pVVar16;
  undefined1 local_1b0 [8];
  VkBufferMemoryBarrier barrier;
  undefined1 local_148 [8];
  VkImageMemoryBarrier layoutBarrier_1;
  undefined1 local_d0 [8];
  VkImageMemoryBarrier layoutBarrier;
  undefined1 local_58 [8];
  VkBufferImageCopy copyRegion;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  ReadImplementation *this_local;
  
  copyRegion.imageExtent._4_8_ = OperationContext::getDeviceInterface(this->m_context);
  pVVar1 = &this->m_imageExtent;
  layoutBarrier._68_4_ = pVVar1->width;
  unique0x00012004 = pVVar1->height;
  makeBufferImageCopy((VkBufferImageCopy *)local_58,this->m_subresourceLayers,*pVVar1);
  pIVar12 = de::details::
            UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            ::operator*(&(this->m_image).
                         super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                       );
  pVVar13 = synchronization::Image::operator*(pIVar12);
  uVar3 = (this->m_subresourceRange).baseArrayLayer;
  uVar5 = (this->m_subresourceRange).aspectMask;
  uVar6 = (this->m_subresourceRange).baseMipLevel;
  uVar7 = (this->m_subresourceRange).levelCount;
  subresourceRange.levelCount = uVar7;
  subresourceRange.baseMipLevel = uVar6;
  subresourceRange.aspectMask = uVar5;
  subresourceRange.baseArrayLayer = uVar3;
  subresourceRange.layerCount = (this->m_subresourceRange).layerCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_d0,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,(VkImage)pVVar13->m_internal,subresourceRange);
  (**(code **)(*(long *)copyRegion.imageExtent._4_8_ + 0x368))
            (copyRegion.imageExtent._4_8_,cmdBuffer,1,0x1000,0,0,0,0,0,1,local_d0);
  uVar11 = copyRegion.imageExtent._4_8_;
  pBVar14 = Resource::getBuffer(this->m_resource);
  dVar2 = (pBVar14->handle).m_internal;
  pIVar12 = de::details::
            UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            ::operator*(&(this->m_image).
                         super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                       );
  pVVar13 = synchronization::Image::operator*(pIVar12);
  layoutBarrier_1._64_8_ = pVVar13->m_internal;
  (**(code **)(*(long *)uVar11 + 0x310))(uVar11,cmdBuffer,dVar2,layoutBarrier_1._64_8_,7,1,local_58)
  ;
  pIVar12 = de::details::
            UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            ::operator*(&(this->m_image).
                         super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                       );
  pVVar13 = synchronization::Image::operator*(pIVar12);
  uVar4 = (this->m_subresourceRange).baseArrayLayer;
  uVar8 = (this->m_subresourceRange).aspectMask;
  uVar9 = (this->m_subresourceRange).baseMipLevel;
  uVar10 = (this->m_subresourceRange).levelCount;
  subresourceRange_00.levelCount = uVar10;
  subresourceRange_00.baseMipLevel = uVar9;
  subresourceRange_00.aspectMask = uVar8;
  subresourceRange_00.baseArrayLayer = uVar4;
  subresourceRange_00.layerCount = (this->m_subresourceRange).layerCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_148,0x1000,0x800,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar13->m_internal,subresourceRange_00);
  (**(code **)(*(long *)copyRegion.imageExtent._4_8_ + 0x368))
            (copyRegion.imageExtent._4_8_,cmdBuffer,0x1000,0x1000,0,0,0,0,0,1,local_148);
  uVar11 = copyRegion.imageExtent._4_8_;
  pIVar12 = de::details::
            UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            ::operator*(&(this->m_image).
                         super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                       );
  pVVar13 = synchronization::Image::operator*(pIVar12);
  dVar2 = pVVar13->m_internal;
  pBVar15 = de::details::
            UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            ::operator*(&(this->m_hostBuffer).
                         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                       );
  pVVar16 = synchronization::Buffer::operator*(pBVar15);
  barrier.size = pVVar16->m_internal;
  (**(code **)(*(long *)uVar11 + 0x318))(uVar11,cmdBuffer,dVar2,6,barrier.size,1,local_58);
  pBVar15 = de::details::
            UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            ::operator*(&(this->m_hostBuffer).
                         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                       );
  pVVar16 = synchronization::Buffer::operator*(pBVar15);
  buffer.m_internal = pVVar16->m_internal;
  pBVar14 = Resource::getBuffer(this->m_resource);
  makeBufferMemoryBarrier((VkBufferMemoryBarrier *)local_1b0,0x1000,0x2000,buffer,0,pBVar14->size);
  (**(code **)(*(long *)copyRegion.imageExtent._4_8_ + 0x368))
            (copyRegion.imageExtent._4_8_,cmdBuffer,0x1000,0x4000,0,0,0,1,(int)local_1b0,0,0);
  return;
}

Assistant:

void recordCommands (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk			= m_context.getDeviceInterface();
		const VkBufferImageCopy	copyRegion	= makeBufferImageCopy(m_subresourceLayers, m_imageExtent);

		// Resource -> Image
		{
			const VkImageMemoryBarrier layoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_TRANSFER_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
				**m_image, m_subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 0u, DE_NULL, 1u, &layoutBarrier);

			vk.cmdCopyBufferToImage(cmdBuffer, m_resource.getBuffer().handle, **m_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyRegion);
		}
		// Image -> Host buffer
		{
			const VkImageMemoryBarrier layoutBarrier = makeImageMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				**m_image, m_subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 0u, DE_NULL, 1u, &layoutBarrier);

			vk.cmdCopyImageToBuffer(cmdBuffer, **m_image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_hostBuffer, 1u, &copyRegion);

			const VkBufferMemoryBarrier	barrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **m_hostBuffer, 0u, m_resource.getBuffer().size);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
	}